

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracer-real-time.cpp
# Opt level: O3

void __thiscall dynamicgraph::OutStringStream::~OutStringStream(OutStringStream *this,void **vtt)

{
  undefined1 *puVar1;
  _func_int **pp_Var2;
  void *pvVar3;
  undefined1 *puVar4;
  
  pp_Var2 = (_func_int **)*vtt;
  (this->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
       = pp_Var2;
  *(void **)((long)&(this->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream + (long)pp_Var2[-3]) = vtt[5];
  pvVar3 = *(void **)&(this->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>
                      .field_0x70;
  if (pvVar3 != (void *)0x0) {
    operator_delete__(pvVar3);
  }
  puVar4 = *(undefined1 **)
            &(this->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>.
             field_0x90;
  puVar1 = &(this->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>.
            field_0xa0;
  if (puVar4 != puVar1) {
    operator_delete(puVar4,*(long *)puVar1 + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this);
  return;
}

Assistant:

OutStringStream::~OutStringStream() {
  dgDEBUGIN(15);
  delete[] buffer;
  dgDEBUGOUT(15);
}